

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderPreservePattern(xmlTextReaderPtr reader,xmlChar *pattern,xmlChar **namespaces)

{
  xmlPatternPtr pxVar1;
  xmlPatternPtr *ppxVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = -1;
  if ((pattern != (xmlChar *)0x0 && reader != (xmlTextReaderPtr)0x0) &&
     (pxVar1 = xmlPatterncompile(pattern,reader->dict,0,namespaces), pxVar1 != (xmlPatternPtr)0x0))
  {
    iVar3 = reader->patternMax;
    if (iVar3 <= reader->patternNr) {
      if (iVar3 < 1) {
        uVar5 = 4;
      }
      else {
        uVar5 = 0xffffffff;
        if (iVar3 < 1000000000) {
          uVar4 = iVar3 + 1U >> 1;
          uVar5 = uVar4 + iVar3;
          if ((int)(1000000000 - uVar4) < iVar3) {
            uVar5 = 1000000000;
          }
        }
      }
      if (((int)uVar5 < 0) ||
         (ppxVar2 = (xmlPatternPtr *)(*xmlRealloc)(reader->patternTab,(ulong)uVar5 << 3),
         ppxVar2 == (xmlPatternPtr *)0x0)) {
        xmlTextReaderErrMemory(reader);
        return -1;
      }
      reader->patternTab = ppxVar2;
      reader->patternMax = uVar5;
    }
    iVar3 = reader->patternNr;
    reader->patternTab[iVar3] = pxVar1;
    reader->patternNr = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int
xmlTextReaderPreservePattern(xmlTextReaderPtr reader, const xmlChar *pattern,
                             const xmlChar **namespaces)
{
    xmlPatternPtr comp;

    if ((reader == NULL) || (pattern == NULL))
	return(-1);

    comp = xmlPatterncompile(pattern, reader->dict, 0, namespaces);
    if (comp == NULL)
        return(-1);

    if (reader->patternNr >= reader->patternMax) {
        xmlPatternPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(reader->patternMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	tmp = xmlRealloc(reader->patternTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	reader->patternTab = tmp;
        reader->patternMax = newSize;
    }
    reader->patternTab[reader->patternNr] = comp;
    return(reader->patternNr++);
}